

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O0

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)

{
  undefined8 in_RDI;
  SQInteger i;
  long local_10;
  
  for (local_10 = 0; mathlib_funcs[local_10].name != (SQChar *)0x0; local_10 = local_10 + 1) {
    sq_pushstring(in_RDI,mathlib_funcs[local_10].name,0xffffffffffffffff);
    sq_newclosure(in_RDI,mathlib_funcs[local_10].f,0);
    sq_setparamscheck(in_RDI,mathlib_funcs[local_10].nparamscheck,mathlib_funcs[local_10].typemask);
    sq_setnativeclosurename(in_RDI,0xffffffffffffffff,mathlib_funcs[local_10].name);
    sq_newslot(in_RDI,0xfffffffffffffffd,0);
  }
  sq_pushstring(in_RDI,"RAND_MAX",0xffffffffffffffff);
  sq_pushinteger(in_RDI,0x7fffffff);
  sq_newslot(in_RDI,0xfffffffffffffffd,0);
  sq_pushstring(in_RDI,"PI",0xffffffffffffffff);
  sq_pushfloat(0x40490fdb,in_RDI);
  sq_newslot(in_RDI,0xfffffffffffffffd,0);
  return 0;
}

Assistant:

SQRESULT sqstd_register_mathlib(HSQUIRRELVM v)
{
    SQInteger i=0;
    while(mathlib_funcs[i].name!=0) {
        sq_pushstring(v,mathlib_funcs[i].name,-1);
        sq_newclosure(v,mathlib_funcs[i].f,0);
        sq_setparamscheck(v,mathlib_funcs[i].nparamscheck,mathlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,mathlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_pushstring(v,_SC("RAND_MAX"),-1);
    sq_pushinteger(v,RAND_MAX);
    sq_newslot(v,-3,SQFalse);
    sq_pushstring(v,_SC("PI"),-1);
    sq_pushfloat(v,(SQFloat)M_PI);
    sq_newslot(v,-3,SQFalse);
    return SQ_OK;
}